

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
          (cmTargetCollectLinkLanguages *this,cmGeneratorTarget *target,string *config,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,cmGeneratorTarget *head)

{
  cmGeneratorTarget *head_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *languages_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmTargetCollectLinkLanguages *this_local;
  
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  std::__cxx11::string::string((string *)this,(string *)config);
  this->Languages = languages;
  this->HeadTarget = head;
  this->Target = (cmGeneratorTarget *)config_local;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->Visited);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::insert(&this->Visited,(value_type *)&config_local);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmGeneratorTarget const* target,
                               std::string config,
                               std::unordered_set<std::string>& languages,
                               cmGeneratorTarget const* head)
    : Config(std::move(config))
    , Languages(languages)
    , HeadTarget(head)
    , Target(target)
  {
    this->Visited.insert(target);
  }